

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O1

void CB_EXPLORE_ADF::predict_or_learn_cover<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  pointer *ppfVar1;
  label *this;
  float fVar2;
  float fVar3;
  example *peVar4;
  pointer pfVar5;
  iterator __position;
  action_score *paVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  float *__args;
  uint uVar12;
  vector<float,std::allocator<float>> *this_00;
  uint uVar13;
  long lVar14;
  double __x;
  undefined1 auVar15 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar19;
  undefined1 auVar20 [16];
  double dVar21;
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ulong local_80;
  vector<float,std::allocator<float>> *local_78;
  v_array<COST_SENSITIVE::label> *local_70;
  v_array<CB::label> *local_68;
  multi_ex *local_60;
  undefined1 local_58 [16];
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  undefined1 auVar18 [16];
  
  if ((data->gen_cs).cb_type == 3) {
    GEN_CS::gen_cs_example_dr<true>(&data->gen_cs,examples,&data->cs_labels);
  }
  else {
    GEN_CS::gen_cs_example<false>(&data->gen_cs,examples,&data->cs_labels);
  }
  LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,0);
  peVar4 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = (long)(peVar4->pred).scalars._end - (long)(peVar4->pred).scalars._begin >> 3;
  local_98 = (float)data->cover_size;
  local_80 = uVar7 & 0xffffffff;
  local_b8 = ZEXT416((uint)(float)local_80);
  lVar8 = data->counter * local_80;
  auVar20._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar20._0_8_ = lVar8;
  auVar20._12_4_ = 0x45300000;
  dVar21 = auVar20._8_8_ - 1.9342813113834067e+25;
  __x = dVar21 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
  local_60 = examples;
  if (__x < 0.0) {
    auVar15._0_8_ = sqrt(__x);
    auVar15._8_8_ = extraout_XMM0_Qb;
  }
  else {
    auVar15._0_8_ = SQRT(__x);
    auVar15._8_8_ = dVar21;
  }
  auVar16._4_12_ = auVar15._4_12_;
  auVar16._0_4_ = (float)auVar15._0_8_;
  auVar18._12_4_ = auVar15._12_4_;
  auVar18._0_8_ = auVar16._0_8_;
  auVar18._8_4_ = auVar15._4_4_;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._4_4_ = local_b8._0_4_;
  auVar17._0_4_ = auVar16._0_4_;
  local_c8._0_12_ = auVar17._0_12_;
  local_c8._12_4_ = local_b8._4_4_;
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  uVar13 = (uint)uVar7;
  if (uVar13 != 0) {
    uVar12 = 0;
    do {
      local_d8._4_4_ = 0;
      local_d8._0_4_ = uVar12;
      v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,(action_score *)local_d8);
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  uVar7 = local_80;
  auVar23 = divps(_DAT_00286480,local_c8);
  pfVar5 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar5) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar5;
  }
  uStack_a0 = auVar23._4_4_;
  local_a8 = CONCAT44(uStack_a0,uStack_a0);
  this_00 = (vector<float,std::allocator<float>> *)&data->scores;
  uStack_9c = uStack_a0;
  local_78 = this_00;
  if (uVar13 != 0) {
    lVar8 = local_80 * 8;
    lVar14 = 0;
    local_c8 = auVar23;
    do {
      __args = (float *)((long)(peVar4->pred).scalars._begin + lVar14 + 4);
      __position._M_current =
           (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  (this_00,__position,__args);
        this_00 = local_78;
        auVar23 = local_c8;
      }
      else {
        *__position._M_current = *__args;
        ppfVar1 = &(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppfVar1 = *ppfVar1 + 1;
      }
      lVar14 = lVar14 + 8;
    } while (lVar8 - lVar14 != 0);
  }
  fVar24 = 1.0 / local_98;
  if ((float)local_a8 <= auVar23._0_4_) {
    auVar23._0_4_ = (float)local_a8;
  }
  if (data->first_only == false) {
    paVar6 = (peVar4->pred).a_s._begin;
    lVar8 = (long)(peVar4->pred).scalars._end - (long)paVar6;
    if (lVar8 == 0) {
      uVar9 = 0;
    }
    else {
      uVar11 = lVar8 >> 3;
      uVar10 = 1;
      uVar9 = uVar10;
      if (1 < uVar11) {
        do {
          uVar9 = uVar10;
          if ((paVar6[uVar10].score != paVar6->score) ||
             (NAN(paVar6[uVar10].score) || NAN(paVar6->score))) break;
          uVar10 = uVar10 + 1;
          uVar9 = uVar11;
        } while (uVar11 != uVar10);
      }
    }
    if (uVar9 != 0) {
      uVar10 = 0;
      do {
        fVar25 = (peVar4->pred).scalars._begin[uVar10 * 2];
        paVar6 = (data->action_probs)._begin;
        paVar6[(uint)fVar25].score = paVar6[(uint)fVar25].score + fVar24 / (float)uVar9;
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
  }
  else {
    uVar12 = ((peVar4->pred).a_s._begin)->action;
    paVar6 = (data->action_probs)._begin;
    paVar6[uVar12].score = paVar6[uVar12].score + fVar24;
  }
  local_b8._0_4_ = (float)local_b8._0_4_ * auVar23._0_4_;
  uVar9 = uVar7;
  if (1 < data->cover_size) {
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    fVar25 = (fVar24 - auVar23._0_4_) + (float)local_b8._0_4_;
    this = &data->cs_labels_2;
    local_68 = &data->cb_labels;
    local_70 = &data->prepped_cs_labels;
    local_a8 = 1;
    local_58 = ZEXT416((uint)fVar24);
    local_c8 = auVar23;
    do {
      local_98 = fVar25;
      v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
      if (uVar13 != 0) {
        lVar8 = 0;
        fVar24 = 0.0;
        do {
          fVar25 = *(float *)((long)&((data->action_probs)._begin)->score + lVar8);
          fVar19 = (float)local_c8._0_4_;
          if ((float)local_c8._0_4_ <= fVar25) {
            fVar19 = fVar25;
          }
          local_d8._4_4_ = fVar24;
          local_d8._0_4_ =
               *(float *)((long)&((data->cs_labels).costs._begin)->x + lVar8 * 2) -
               (data->psi * (float)local_c8._0_4_) / (fVar19 / local_98);
          local_d0._0_4_ = 0.0;
          local_d0._4_4_ = 0.0;
          v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,(wclass *)local_d8);
          fVar24 = (float)((int)fVar24 + 1);
          lVar8 = lVar8 + 8;
        } while (uVar7 * 8 - lVar8 != 0);
      }
      local_a8 = local_a8 + 1;
      GEN_CS::call_cs_ldf<true>
                (data->cs_ldf_learner,local_60,local_68,this,local_70,data->offset,local_a8);
      if (uVar13 != 0) {
        uVar9 = 0;
        do {
          *(float *)(*(long *)local_78 + uVar9 * 4) =
               (peVar4->pred).a_s._begin[uVar9].score + *(float *)(*(long *)local_78 + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while (local_80 != uVar9);
      }
      fVar24 = local_c8._0_4_;
      if (data->first_only == false) {
        paVar6 = (peVar4->pred).a_s._begin;
        lVar8 = (long)(peVar4->pred).scalars._end - (long)paVar6;
        if (lVar8 == 0) {
          uVar9 = 0;
        }
        else {
          uVar11 = lVar8 >> 3;
          uVar10 = 1;
          uVar9 = uVar10;
          if (1 < uVar11) {
            do {
              uVar9 = uVar10;
              if ((paVar6[uVar10].score != paVar6->score) ||
                 (NAN(paVar6[uVar10].score) || NAN(paVar6->score))) break;
              uVar10 = uVar10 + 1;
              uVar9 = uVar11;
            } while (uVar11 != uVar10);
          }
        }
        fVar25 = local_98;
        if (uVar9 != 0) {
          fVar19 = (float)local_58._0_4_ / (float)uVar9;
          uVar10 = 0;
          do {
            fVar3 = (peVar4->pred).scalars._begin[uVar10 * 2];
            paVar6 = (data->action_probs)._begin;
            fVar2 = paVar6[(uint)fVar3].score;
            fVar22 = (fVar2 - fVar24) + fVar19;
            uVar11 = (ulong)fVar22;
            fVar25 = fVar25 + (float)(~-(uint)(fVar2 < fVar24) & (uint)fVar19 |
                                     (uint)(float)((long)(fVar22 - 9.223372e+18) &
                                                   (long)uVar11 >> 0x3f | uVar11) &
                                     -(uint)(fVar2 < fVar24));
            paVar6[(uint)fVar3].score = fVar19 + fVar2;
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
      }
      else {
        uVar12 = ((peVar4->pred).a_s._begin)->action;
        paVar6 = (data->action_probs)._begin;
        fVar25 = paVar6[uVar12].score;
        fVar19 = (fVar25 - fVar24) + (float)local_58._0_4_;
        uVar9 = (ulong)fVar19;
        paVar6[uVar12].score = (float)local_58._0_4_ + fVar25;
        fVar25 = local_98 +
                 (float)(~-(uint)(fVar25 < fVar24) & local_58._0_4_ |
                        (uint)(float)((long)(fVar19 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9) &
                        -(uint)(fVar25 < fVar24));
      }
      uVar9 = local_80;
    } while (local_a8 < data->cover_size);
  }
  local_d0 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_d8 = (undefined1  [8])
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>(data->nounif ^ 1);
  do_sort(data);
  if (uVar9 != 0) {
    uVar7 = 0;
    do {
      *(action_score *)((peVar4->pred).scalars._begin + uVar7 * 2) =
           (data->action_probs)._begin[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  data->counter = data->counter + 1;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.
  const bool is_mtr = data.gen_cs.cb_type == CB_TYPE_MTR;
  if (is_learn)
  {
    if (is_mtr)  // use DR estimates for non-ERM policies in MTR
      GEN_CS::gen_cs_example_dr<true>(data.gen_cs, examples, data.cs_labels);
    else
      GEN_CS::gen_cs_example<false>(data.gen_cs, examples, data.cs_labels);
    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
  {
    GEN_CS::gen_cs_example_ips(examples, data.cs_labels);
    multiline_learn_or_predict<false>(base, examples, data.offset);
  }

  v_array<action_score>& preds = examples[0]->pred.a_s;
  const uint32_t num_actions = (uint32_t)preds.size();

  float additive_probability = 1.f / (float)data.cover_size;
  const float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));
  v_array<action_score>& probs = data.action_probs;
  probs.clear();
  for (uint32_t i = 0; i < num_actions; i++) probs.push_back({i, 0.});
  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(preds[i].score);

  if (!data.first_only)
  {
    size_t tied_actions = fill_tied(data, preds);
    for (size_t i = 0; i < tied_actions; ++i) probs[preds[i].action].score += additive_probability / tied_actions;
  }
  else
    probs[preds[0].action].score += additive_probability;

  float norm = min_prob * num_actions + (additive_probability - min_prob);
  for (size_t i = 1; i < data.cover_size; i++)
  {
    // Create costs of each action based on online cover
    if (is_learn)
    {
      data.cs_labels_2.costs.clear();
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost = data.cs_labels.costs[j].x - data.psi * min_prob / (max(probs[j].score, min_prob) / norm);
        data.cs_labels_2.costs.push_back({pseudo_cost, j, 0., 0.});
      }
      GEN_CS::call_cs_ldf<true>(*(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels_2,
          data.prepped_cs_labels, data.offset, i + 1);
    }
    else
      GEN_CS::call_cs_ldf<false>(
          *(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset, i + 1);

    for (uint32_t i = 0; i < num_actions; i++) data.scores[i] += preds[i].score;
    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      const float add_prob = additive_probability / tied_actions;
      for (size_t i = 0; i < tied_actions; ++i)
      {
        if (probs[preds[i].action].score < min_prob)
          norm += max(0, add_prob - (min_prob - probs[preds[i].action].score));
        else
          norm += add_prob;
        probs[preds[i].action].score += add_prob;
      }
    }
    else
    {
      uint32_t action = preds[0].action;
      if (probs[action].score < min_prob)
        norm += max(0, additive_probability - (min_prob - probs[action].score));
      else
        norm += additive_probability;
      probs[action].score += additive_probability;
    }
  }

  enforce_minimum_probability(min_prob * num_actions, !data.nounif, begin_scores(probs), end_scores(probs));

  do_sort(data);
  for (size_t i = 0; i < num_actions; i++) preds[i] = probs[i];

  ++data.counter;
}